

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

void phosg::format_data(function<void_(const_void_*,_unsigned_long)> *write_data,iovec *iovs,
                       size_t num_iovs,uint64_t start_address,iovec *prev_iovs,size_t num_prev_iovs,
                       uint64_t flags)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  size_t *psVar6;
  long lVar7;
  ulong uVar8;
  logic_error *this;
  byte bVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  code *pcVar14;
  void *pvVar15;
  double dVar16;
  uint uVar17;
  undefined *puVar18;
  ulong uVar19;
  iovec *piVar20;
  void *pvVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  float fVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  uint8_t current_value;
  string field;
  RedBoldTerminalGuard g;
  uint8_t line_buf [16];
  string line;
  uint8_t prev_line_buf [16];
  string local_218;
  double local_1f8;
  double local_1f0;
  undefined1 local_1e8 [16];
  _Any_data local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Any_data local_1b0 [2];
  double local_188;
  uint local_17c;
  double *local_178;
  ulong local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  ulong local_160;
  double local_158;
  long lStack_150;
  double local_140;
  size_t local_138;
  ulong local_130;
  iovec *local_128;
  iovec *local_120;
  ulong local_118;
  size_t local_110;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  ulong local_e0;
  uint64_t local_d8;
  char *local_d0;
  void *local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  double local_48 [3];
  
  if (num_iovs != 0) {
    psVar6 = &iovs->iov_len;
    lVar22 = 0;
    sVar11 = num_iovs;
    do {
      lVar22 = lVar22 + *psVar6;
      psVar6 = psVar6 + 2;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
    if (lVar22 != 0) {
      local_138 = num_prev_iovs;
      local_110 = num_iovs;
      if (num_prev_iovs != 0) {
        psVar6 = &prev_iovs->iov_len;
        lVar7 = 0;
        sVar11 = num_prev_iovs;
        do {
          lVar7 = lVar7 + *psVar6;
          psVar6 = psVar6 + 2;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
        local_128 = prev_iovs;
        local_120 = iovs;
        if (lVar7 != lVar22) {
LAB_0012b231:
          this = (logic_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    ((runtime_error *)this,"previous iovs given, but data size does not match");
          puVar18 = &::std::runtime_error::typeinfo;
          pcVar14 = ::std::runtime_error::~runtime_error;
LAB_0012b1e3:
          __cxa_throw(this,puVar18,pcVar14);
        }
      }
      uVar23 = lVar22 + start_address;
      local_17c = 2;
      uVar17 = (uint)flags;
      if (((((uVar17 >> 8 & 1) == 0) && (local_17c = 4, (uVar17 >> 9 & 1) == 0)) &&
          (local_17c = 8, (uVar17 >> 10 & 1) == 0)) &&
         (((local_17c = 0x10, (uVar17 >> 0xb & 1) == 0 && (uVar23 < 0x100000001)) &&
          (local_17c = 8, uVar23 < 0x10001)))) {
        local_17c = (uint)(0x100 < uVar23) * 2 + 2;
      }
      local_158 = 0.0;
      lStack_150 = 0;
      if (num_prev_iovs == 0) {
        local_178 = &local_158;
      }
      else {
        local_178 = local_48;
        local_48[0] = 0.0;
        local_48[1] = 0.0;
      }
      uVar12 = start_address & 0xfffffffffffffff0;
      local_b0 = uVar12 - uVar23;
      if (uVar12 < uVar23) {
        bVar31 = (flags & 0x40) == 0;
        uVar29 = (ulong)bVar31;
        local_d0 = "%0*lX";
        if (bVar31) {
          local_d0 = "%0*lX |";
        }
        local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar29 * 2 + 1);
        local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(uVar29 + 1);
        local_b8 = (ulong)((uint)start_address & 0xf);
        local_120 = (iovec *)&iovs->iov_len;
        local_128 = (iovec *)&prev_iovs->iov_len;
        local_c0 = start_address - uVar12;
        pvVar21 = (void *)0x0;
        uVar29 = 0;
        pvVar15 = (void *)0x0;
        uVar30 = 0;
        local_e0 = uVar23;
        local_d8 = start_address;
        do {
          local_b0 = local_b0 + 0x10;
          local_130 = 0;
          if (0 < (long)local_c0) {
            local_130 = local_c0;
          }
          uVar24 = 0;
          if (0 < (long)local_b8) {
            uVar24 = local_b8;
          }
          iVar5 = 0;
          if (0 < local_b0) {
            iVar5 = (int)local_b0;
          }
          uVar8 = (ulong)(0x10U - (iVar5 + (int)uVar24) & 0xff);
          local_118 = uVar12 + 0x10;
          local_170 = start_address - uVar12;
          if ((long)local_170 < 1) {
            local_170 = 0;
          }
          uVar28 = local_118 - uVar23;
          if ((long)uVar28 < 1) {
            uVar28 = 0;
          }
          uVar13 = (0x10 - local_170) - uVar28;
          if ((char)uVar13 != '\0') {
            uVar19 = 0;
            do {
              piVar20 = local_120 + uVar30;
              while (piVar20->iov_base <= pvVar15) {
                uVar30 = uVar30 + 1;
                piVar20 = piVar20 + 1;
                pvVar15 = (void *)0x0;
                if (local_110 <= uVar30) {
                  this = (logic_error *)__cxa_allocate_exception(0x10);
                  ::std::logic_error::logic_error(this,"reads exceeded final iov");
                  goto LAB_0012b1d5;
                }
              }
              *(undefined1 *)((long)&local_158 + uVar19 + (local_170 & 0xff)) =
                   *(undefined1 *)(piVar20[-1].iov_len + (long)pvVar15);
              pvVar15 = (void *)((long)pvVar15 + 1);
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar8);
          }
          if ((local_138 != 0) && ((uVar13 & 0xff) != 0)) {
            uVar13 = 0;
            do {
              piVar20 = local_128 + uVar29;
              while (piVar20->iov_base <= pvVar21) {
                uVar29 = uVar29 + 1;
                piVar20 = piVar20 + 1;
                pvVar21 = (void *)0x0;
                if (local_138 <= uVar29) {
                  this = (logic_error *)__cxa_allocate_exception(0x10);
                  ::std::logic_error::logic_error(this,"reads exceeded final prev iov");
LAB_0012b1d5:
                  puVar18 = &::std::logic_error::typeinfo;
                  pcVar14 = ::std::logic_error::~logic_error;
                  goto LAB_0012b1e3;
                }
              }
              *(undefined1 *)((long)local_48 + uVar13 + (local_170 & 0xff)) =
                   *(undefined1 *)(piVar20[-1].iov_len + (long)pvVar21);
              pvVar21 = (void *)((long)pvVar21 + 1);
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar8);
          }
          if (((((flags & 0x20) == 0) || (uVar12 <= start_address)) || (uVar23 <= local_118)) ||
             ((local_158 != 0.0 || lStack_150 != 0 || (*local_178 != 0.0 || local_178[1] != 0.0))))
          {
            local_c8 = pvVar21;
            string_printf_abi_cxx11_(&local_108,local_d0,(ulong)local_17c);
            local_1b0[0]._M_unused._M_object = local_108._M_dataplus._M_p;
            local_1d8._M_unused._M_object = (void *)local_108._M_string_length;
            if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_0012b1eb;
            (*write_data->_M_invoker)
                      ((_Any_data *)write_data,(void **)local_1b0,
                       (unsigned_long *)local_1d8._M_pod_data);
            dVar16 = (double)(uVar24 & 0xff);
            local_188 = (double)(local_170 & 0xff);
            dVar25 = dVar16;
            if (local_188 == 0.0) {
              dVar26 = 0.0;
            }
            else {
              do {
                local_1b0[0]._M_unused._M_object = "   ";
                local_1d8._M_unused._M_member_pointer = 3;
                if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0012b1f0;
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)local_1b0,
                           (unsigned_long *)local_1d8._M_pod_data);
                dVar25 = (double)((long)dVar25 - 1);
                dVar26 = dVar16;
              } while (dVar25 != 0.0);
            }
            local_160 = uVar28 & 0xff;
            local_1f0 = (double)(0x10 - local_160);
            local_140 = dVar16;
            bVar9 = (byte)flags;
            if ((ulong)dVar26 < (ulong)local_1f0) {
              do {
                bVar1 = *(byte *)((long)&local_158 + (long)dVar26);
                bVar2 = *(byte *)((long)local_178 + (long)dVar26);
                ::std::function<void_(const_void_*,_unsigned_long)>::function
                          ((function<void_(const_void_*,_unsigned_long)> *)&local_88,write_data);
                local_1f8 = (double)CONCAT44(local_1f8._4_4_,(uint)bVar1);
                RedBoldTerminalGuard::RedBoldTerminalGuard
                          ((RedBoldTerminalGuard *)local_1b0,
                           (function<void_(const_void_*,_unsigned_long)> *)&local_88,
                           (bool)(bVar2 != bVar1 & bVar9));
                dVar16 = local_140;
                if (local_78 != (code *)0x0) {
                  (*local_78)(&local_88,&local_88,__destroy_functor);
                }
                string_printf_abi_cxx11_((string *)&local_1d8," %02X",(ulong)local_1f8 & 0xffffffff)
                ;
                local_218._M_dataplus._M_p = (pointer)local_1d8._M_unused._0_8_;
                local_1e8._8_8_ = local_1d8._8_8_;
                if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0012b1fa;
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)&local_218,
                           (unsigned_long *)(local_1e8 + 8));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_unused._0_8_ != &local_1c8) {
                  operator_delete(local_1d8._M_unused._M_object,
                                  (ulong)(local_1c8._M_allocated_capacity + 1));
                }
                RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0);
                dVar26 = (double)((long)dVar26 + 1);
              } while ((ulong)dVar26 < (ulong)local_1f0);
            }
            if ((ulong)dVar26 < 0x10) {
              lVar22 = (long)dVar26 - 0x10;
              do {
                local_1b0[0]._M_unused._M_object = "   ";
                local_1d8._M_unused._M_member_pointer = 3;
                if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0012b1f0;
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)local_1b0,
                           (unsigned_long *)local_1d8._M_pod_data);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 0);
            }
            if ((flags & 2) != 0) {
              local_1b0[0]._M_unused._M_object = " | ";
              local_1d8._M_unused._M_object = local_e8;
              if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
              goto LAB_0012b1eb;
              (*write_data->_M_invoker)
                        ((_Any_data *)write_data,(void **)local_1b0,
                         (unsigned_long *)local_1d8._M_pod_data);
              dVar25 = dVar16;
              if (local_188 == 0.0) {
                dVar16 = 0.0;
              }
              else {
                do {
                  local_1b0[0]._M_unused._M_object = " ";
                  local_1d8._M_unused._M_member_pointer = 1;
                  if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_0012b1f5;
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  dVar25 = (double)((long)dVar25 - 1);
                } while (dVar25 != 0.0);
              }
              if ((ulong)dVar16 < (ulong)local_1f0) {
                do {
                  local_1e8[0] = *(undefined1 *)((long)&local_158 + (long)dVar16);
                  cVar3 = *(char *)((long)local_178 + (long)dVar16);
                  ::std::function<void_(const_void_*,_unsigned_long)>::function
                            ((function<void_(const_void_*,_unsigned_long)> *)&local_a8,write_data);
                  RedBoldTerminalGuard::RedBoldTerminalGuard
                            ((RedBoldTerminalGuard *)local_1b0,
                             (function<void_(const_void_*,_unsigned_long)> *)&local_a8,
                             (bool)(cVar3 != local_1e8[0] & bVar9));
                  if (local_98 != (code *)0x0) {
                    (*local_98)(&local_a8,&local_a8,__destroy_functor);
                  }
                  if ((byte)(local_1e8[0] + 0x81) < 0xa1) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::function
                              ((function<void_(const_void_*,_unsigned_long)> *)&local_68,write_data)
                    ;
                    InverseTerminalGuard::InverseTerminalGuard
                              ((InverseTerminalGuard *)&local_1d8,
                               (function<void_(const_void_*,_unsigned_long)> *)&local_68,
                               (bool)(bVar9 & 1));
                    if (local_58 != (code *)0x0) {
                      (*local_58)(&local_68,&local_68,__destroy_functor);
                    }
                    local_218._M_dataplus._M_p = " ";
                    local_1e8._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
                    if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                    goto LAB_0012b1ff;
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)&local_218,
                               (unsigned_long *)(local_1e8 + 8));
                    InverseTerminalGuard::~InverseTerminalGuard((InverseTerminalGuard *)&local_1d8);
                  }
                  else {
                    local_1d8._M_unused._M_object = local_1e8;
                    local_218._M_dataplus._M_p = (pointer)0x1;
                    if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                    goto LAB_0012b204;
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)&local_1d8,
                               (unsigned_long *)&local_218);
                  }
                  RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0);
                  dVar16 = (double)((long)dVar16 + 1);
                } while ((ulong)dVar16 < (ulong)local_1f0);
              }
              if ((ulong)dVar16 < 0x10) {
                lVar22 = (long)dVar16 - 0x10;
                do {
                  local_1b0[0]._M_unused._M_object = " ";
                  local_1d8._M_unused._M_member_pointer = 1;
                  if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_0012b1f5;
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 0);
              }
            }
            uVar10 = (uint)local_130 & 0xff;
            local_130 = (ulong)uVar10;
            if ((flags & 4) != 0) {
              uVar23 = (ulong)(uVar10 + 3 >> 2);
              if ((flags & 0x10) == 0) {
                if ((uVar17 >> 0xc & 1) == 0) {
                  if ((uVar17 >> 0xd & 1) == 0) {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        uVar12 = 0;
                      }
                      else {
                        uVar12 = (ulong)(SUB84(local_188,0) + 3U >> 2);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar23 = uVar23 - 1;
                        } while (uVar23 != 0);
                      }
                      iVar5 = (int)local_160;
                      for (; uVar12 < 4 - (ulong)(iVar5 + 3U >> 2); uVar12 = uVar12 + 1) {
                        local_1f8 = (double)CONCAT44(local_1f8._4_4_,
                                                     *(undefined4 *)((long)&local_158 + uVar12 * 4))
                        ;
                        local_1f0 = (double)CONCAT44(local_1f0._4_4_,
                                                     *(undefined4 *)((long)local_178 + uVar12 * 4));
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0._0_4_ != local_1f8._0_4_ & bVar9));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f8._0_4_);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b21d;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if (uVar12 < 4) {
                        lVar22 = uVar12 - 4;
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 0);
                      }
                      goto LAB_0012a856;
                    }
                  }
                  else {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        uVar12 = 0;
                      }
                      else {
                        uVar12 = (ulong)(SUB84(local_188,0) + 3U >> 2);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar23 = uVar23 - 1;
                        } while (uVar23 != 0);
                      }
                      iVar5 = (int)local_160;
                      for (; uVar12 < 4 - (ulong)(iVar5 + 3U >> 2); uVar12 = uVar12 + 1) {
                        local_1f8 = (double)CONCAT44(local_1f8._4_4_,
                                                     *(undefined4 *)((long)&local_158 + uVar12 * 4))
                        ;
                        local_1f0 = (double)CONCAT44(local_1f0._4_4_,
                                                     *(undefined4 *)((long)local_178 + uVar12 * 4));
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0._0_4_ != local_1f8._0_4_ & bVar9));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f8._0_4_);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b222;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if (uVar12 < 4) {
                        lVar22 = uVar12 - 4;
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 0);
                      }
                      goto LAB_0012a856;
                    }
                  }
                }
                else {
                  local_1b0[0]._M_unused._M_object = " |";
                  local_1d8._M_unused._M_object = local_168;
                  if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)local_1b0,
                               (unsigned_long *)local_1d8._M_pod_data);
                    if ((char)local_170 == '\0') {
                      dVar16 = 0.0;
                    }
                    else {
                      dVar16 = (double)(ulong)(SUB84(local_188,0) + 3U >> 2);
                      do {
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_1d8._M_unused._M_member_pointer = 0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b1eb;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)local_1d8._M_pod_data);
                        uVar23 = uVar23 - 1;
                      } while (uVar23 != 0);
                    }
                    local_140 = (double)(4 - (ulong)((int)local_160 + 3U >> 2));
                    if ((ulong)dVar16 < (ulong)local_140) {
                      do {
                        uVar10 = *(uint *)((long)&local_158 + (long)dVar16 * 4);
                        uVar4 = *(uint *)((long)local_178 + (long)dVar16 * 4);
                        local_1f8 = dVar16;
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        fVar27 = (float)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                         (uVar10 & 0xff00) << 8 | uVar10 << 0x18);
                        local_1f0 = (double)CONCAT44(local_1f0._4_4_,fVar27);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)((float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                                  (uVar4 & 0xff00) << 8 | uVar4 << 0x18) != fVar27 &
                                         bVar9));
                        dVar16 = local_1f8;
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f0._0_4_);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b213;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                        dVar16 = (double)((long)dVar16 + 1);
                      } while ((ulong)dVar16 < (ulong)local_140);
                    }
                    if ((ulong)dVar16 < 4) {
                      lVar22 = (long)dVar16 - 4;
                      do {
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_218._M_dataplus._M_p = (pointer)0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b1eb;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)&local_218);
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 0);
                    }
                    goto LAB_0012a856;
                  }
                }
              }
              else {
                local_1b0[0]._M_unused._M_object = " |";
                local_1d8._M_unused._M_object = local_168;
                if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  if ((char)local_170 == '\0') {
                    dVar16 = 0.0;
                  }
                  else {
                    dVar16 = (double)(ulong)(SUB84(local_188,0) + 3U >> 2);
                    do {
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_1d8._M_unused._M_member_pointer = 0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0012b1eb;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      uVar23 = uVar23 - 1;
                    } while (uVar23 != 0);
                  }
                  local_140 = (double)(4 - (ulong)((int)local_160 + 3U >> 2));
                  if ((ulong)dVar16 < (ulong)local_140) {
                    do {
                      uVar10 = *(uint *)((long)&local_158 + (long)dVar16 * 4);
                      uVar4 = *(uint *)((long)local_178 + (long)dVar16 * 4);
                      local_1f8 = dVar16;
                      ::std::function<void_(const_void_*,_unsigned_long)>::function
                                ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 write_data);
                      fVar27 = (float)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 |
                                       (uVar10 & 0xff00) << 8 | uVar10 << 0x18);
                      local_1f0 = (double)CONCAT44(local_1f0._4_4_,fVar27);
                      RedBoldTerminalGuard::RedBoldTerminalGuard
                                ((RedBoldTerminalGuard *)local_1b0,
                                 (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 (bool)((float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                                (uVar4 & 0xff00) << 8 | uVar4 << 0x18) != fVar27 &
                                       bVar9));
                      dVar16 = local_1f8;
                      if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                        (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                      }
                      string_printf_abi_cxx11_(&local_218," %12.5g",(double)local_1f0._0_4_);
                      local_1e8._8_8_ = local_218._M_dataplus._M_p;
                      local_1e8._0_8_ = local_218._M_string_length;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0012b209;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                 (unsigned_long *)local_1e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_218._M_dataplus._M_p != &local_218.field_2) {
                        operator_delete(local_218._M_dataplus._M_p,
                                        local_218.field_2._M_allocated_capacity + 1);
                      }
                      RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0)
                      ;
                      dVar16 = (double)((long)dVar16 + 1);
                    } while ((ulong)dVar16 < (ulong)local_140);
                  }
                  if ((ulong)dVar16 < 4) {
                    lVar22 = (long)dVar16 - 4;
                    do {
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_218._M_dataplus._M_p = (pointer)0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0012b1eb;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)&local_218);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 0);
                  }
                  goto LAB_0012a856;
                }
              }
              goto LAB_0012b1eb;
            }
LAB_0012a856:
            if ((flags & 8) == 0) {
LAB_0012a85e:
              local_1b0[0]._M_unused._M_object = "\n";
              local_1d8._M_unused._M_member_pointer = 1;
              if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                (*write_data->_M_invoker)
                          ((_Any_data *)write_data,(void **)local_1b0,
                           (unsigned_long *)local_1d8._M_pod_data);
                start_address = local_d8;
                pvVar21 = local_c8;
                uVar23 = local_e0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                  start_address = local_d8;
                  pvVar21 = local_c8;
                  uVar23 = local_e0;
                }
                goto LAB_0012a8cc;
              }
            }
            else {
              uVar23 = (ulong)((int)local_130 + 7U >> 3);
              if ((flags & 0x10) == 0) {
                if ((uVar17 >> 0xc & 1) == 0) {
                  if ((uVar17 >> 0xd & 1) == 0) {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        dVar16 = 0.0;
                      }
                      else {
                        local_188 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar23 = uVar23 - 1;
                          dVar16 = local_188;
                        } while (uVar23 != 0);
                      }
                      iVar5 = (int)local_160;
                      for (; (ulong)dVar16 < 2 - (ulong)(iVar5 + 7U >> 3);
                          dVar16 = (double)((long)dVar16 + 1)) {
                        local_1f8 = (&local_158)[(long)dVar16];
                        local_1f0 = local_178[(long)dVar16];
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0 != local_1f8 & bVar9));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b227;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if ((ulong)dVar16 < 2) {
                        lVar22 = (long)dVar16 - 1;
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          lVar22 = lVar22 + 1;
                        } while (lVar22 == 0);
                      }
                      goto LAB_0012a85e;
                    }
                  }
                  else {
                    local_1b0[0]._M_unused._M_object = " |";
                    local_1d8._M_unused._M_object = local_168;
                    if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      if ((char)local_170 == '\0') {
                        dVar16 = 0.0;
                      }
                      else {
                        local_188 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_1d8._M_unused._M_member_pointer = 0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)local_1d8._M_pod_data);
                          uVar23 = uVar23 - 1;
                          dVar16 = local_188;
                        } while (uVar23 != 0);
                      }
                      iVar5 = (int)local_160;
                      for (; (ulong)dVar16 < 2 - (ulong)(iVar5 + 7U >> 3);
                          dVar16 = (double)((long)dVar16 + 1)) {
                        local_1f8 = (&local_158)[(long)dVar16];
                        local_1f0 = local_178[(long)dVar16];
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)(local_1f0 != local_1f8 & bVar9));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b22c;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                      }
                      if ((ulong)dVar16 < 2) {
                        lVar22 = (long)dVar16 - 1;
                        do {
                          local_1b0[0]._M_unused._M_object = "             ";
                          local_218._M_dataplus._M_p = (pointer)0xd;
                          if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                          goto LAB_0012b1eb;
                          (*write_data->_M_invoker)
                                    ((_Any_data *)write_data,(void **)local_1b0,
                                     (unsigned_long *)&local_218);
                          lVar22 = lVar22 + 1;
                        } while (lVar22 == 0);
                      }
                      goto LAB_0012a85e;
                    }
                  }
                }
                else {
                  local_1b0[0]._M_unused._M_object = " |";
                  local_1d8._M_unused._M_object = local_168;
                  if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*write_data->_M_invoker)
                              ((_Any_data *)write_data,(void **)local_1b0,
                               (unsigned_long *)local_1d8._M_pod_data);
                    if ((char)local_170 == '\0') {
                      dVar16 = 0.0;
                    }
                    else {
                      dVar16 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                      do {
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_1d8._M_unused._M_member_pointer = 0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b1eb;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)local_1d8._M_pod_data);
                        uVar23 = uVar23 - 1;
                      } while (uVar23 != 0);
                    }
                    local_1f0 = (double)(2 - (ulong)((int)local_160 + 7U >> 3));
                    if ((ulong)dVar16 < (ulong)local_1f0) {
                      do {
                        dVar25 = (&local_158)[(long)dVar16];
                        dVar26 = local_178[(long)dVar16];
                        local_188 = dVar16;
                        ::std::function<void_(const_void_*,_unsigned_long)>::function
                                  ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   write_data);
                        local_1f8 = (double)((ulong)dVar25 >> 0x38 |
                                             ((ulong)dVar25 & 0xff000000000000) >> 0x28 |
                                             ((ulong)dVar25 & 0xff0000000000) >> 0x18 |
                                             ((ulong)dVar25 & 0xff00000000) >> 8 |
                                             ((ulong)dVar25 & 0xff000000) << 8 |
                                             ((ulong)dVar25 & 0xff0000) << 0x18 |
                                             ((ulong)dVar25 & 0xff00) << 0x28 | (long)dVar25 << 0x38
                                            );
                        RedBoldTerminalGuard::RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0,
                                   (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                   (bool)((double)((ulong)dVar26 >> 0x38 |
                                                   ((ulong)dVar26 & 0xff000000000000) >> 0x28 |
                                                   ((ulong)dVar26 & 0xff0000000000) >> 0x18 |
                                                   ((ulong)dVar26 & 0xff00000000) >> 8 |
                                                   ((ulong)dVar26 & 0xff000000) << 8 |
                                                   ((ulong)dVar26 & 0xff0000) << 0x18 |
                                                   ((ulong)dVar26 & 0xff00) << 0x28 |
                                                  (long)dVar26 << 0x38) != local_1f8 & bVar9));
                        if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                          (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                        }
                        string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                        local_1e8._8_8_ = local_218._M_dataplus._M_p;
                        local_1e8._0_8_ = local_218._M_string_length;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b218;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                   (unsigned_long *)local_1e8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_218._M_dataplus._M_p != &local_218.field_2) {
                          operator_delete(local_218._M_dataplus._M_p,
                                          local_218.field_2._M_allocated_capacity + 1);
                        }
                        RedBoldTerminalGuard::~RedBoldTerminalGuard
                                  ((RedBoldTerminalGuard *)local_1b0);
                        dVar16 = (double)((long)local_188 + 1);
                      } while ((ulong)dVar16 < (ulong)local_1f0);
                    }
                    if ((ulong)dVar16 < 2) {
                      lVar22 = (long)dVar16 - 1;
                      do {
                        local_1b0[0]._M_unused._M_object = "             ";
                        local_218._M_dataplus._M_p = (pointer)0xd;
                        if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                        goto LAB_0012b1eb;
                        (*write_data->_M_invoker)
                                  ((_Any_data *)write_data,(void **)local_1b0,
                                   (unsigned_long *)&local_218);
                        lVar22 = lVar22 + 1;
                      } while (lVar22 == 0);
                    }
                    goto LAB_0012a85e;
                  }
                }
              }
              else {
                local_1b0[0]._M_unused._M_object = " |";
                local_1d8._M_unused._M_object = local_168;
                if ((write_data->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*write_data->_M_invoker)
                            ((_Any_data *)write_data,(void **)local_1b0,
                             (unsigned_long *)local_1d8._M_pod_data);
                  if ((char)local_170 == '\0') {
                    dVar16 = 0.0;
                  }
                  else {
                    dVar16 = (double)(ulong)(SUB84(local_188,0) + 7U >> 3);
                    do {
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_1d8._M_unused._M_member_pointer = 0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0012b1eb;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)local_1d8._M_pod_data);
                      uVar23 = uVar23 - 1;
                    } while (uVar23 != 0);
                  }
                  local_1f0 = (double)(2 - (ulong)((int)local_160 + 7U >> 3));
                  if ((ulong)dVar16 < (ulong)local_1f0) {
                    do {
                      dVar25 = (&local_158)[(long)dVar16];
                      dVar26 = local_178[(long)dVar16];
                      local_188 = dVar16;
                      ::std::function<void_(const_void_*,_unsigned_long)>::function
                                ((function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 write_data);
                      local_1f8 = (double)((ulong)dVar25 >> 0x38 |
                                           ((ulong)dVar25 & 0xff000000000000) >> 0x28 |
                                           ((ulong)dVar25 & 0xff0000000000) >> 0x18 |
                                           ((ulong)dVar25 & 0xff00000000) >> 8 |
                                           ((ulong)dVar25 & 0xff000000) << 8 |
                                           ((ulong)dVar25 & 0xff0000) << 0x18 |
                                           ((ulong)dVar25 & 0xff00) << 0x28 | (long)dVar25 << 0x38);
                      RedBoldTerminalGuard::RedBoldTerminalGuard
                                ((RedBoldTerminalGuard *)local_1b0,
                                 (function<void_(const_void_*,_unsigned_long)> *)&local_1d8,
                                 (bool)((double)((ulong)dVar26 >> 0x38 |
                                                 ((ulong)dVar26 & 0xff000000000000) >> 0x28 |
                                                 ((ulong)dVar26 & 0xff0000000000) >> 0x18 |
                                                 ((ulong)dVar26 & 0xff00000000) >> 8 |
                                                 ((ulong)dVar26 & 0xff000000) << 8 |
                                                 ((ulong)dVar26 & 0xff0000) << 0x18 |
                                                 ((ulong)dVar26 & 0xff00) << 0x28 |
                                                (long)dVar26 << 0x38) != local_1f8 & bVar9));
                      if ((code *)local_1c8._M_allocated_capacity != (code *)0x0) {
                        (*(code *)local_1c8._M_allocated_capacity)(&local_1d8,&local_1d8,3);
                      }
                      string_printf_abi_cxx11_(&local_218," %12.5lg",local_1f8);
                      local_1e8._8_8_ = local_218._M_dataplus._M_p;
                      local_1e8._0_8_ = local_218._M_string_length;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0012b20e;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)(local_1e8 + 8),
                                 (unsigned_long *)local_1e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_218._M_dataplus._M_p != &local_218.field_2) {
                        operator_delete(local_218._M_dataplus._M_p,
                                        local_218.field_2._M_allocated_capacity + 1);
                      }
                      RedBoldTerminalGuard::~RedBoldTerminalGuard((RedBoldTerminalGuard *)local_1b0)
                      ;
                      dVar16 = (double)((long)local_188 + 1);
                    } while ((ulong)dVar16 < (ulong)local_1f0);
                  }
                  if ((ulong)dVar16 < 2) {
                    lVar22 = (long)dVar16 - 1;
                    do {
                      local_1b0[0]._M_unused._M_object = "             ";
                      local_218._M_dataplus._M_p = (pointer)0xd;
                      if ((write_data->super__Function_base)._M_manager == (_Manager_type)0x0)
                      goto LAB_0012b1eb;
                      (*write_data->_M_invoker)
                                ((_Any_data *)write_data,(void **)local_1b0,
                                 (unsigned_long *)&local_218);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 == 0);
                  }
                  goto LAB_0012a85e;
                }
              }
            }
LAB_0012b1eb:
            ::std::__throw_bad_function_call();
LAB_0012b1f0:
            ::std::__throw_bad_function_call();
LAB_0012b1f5:
            ::std::__throw_bad_function_call();
LAB_0012b1fa:
            ::std::__throw_bad_function_call();
LAB_0012b1ff:
            ::std::__throw_bad_function_call();
LAB_0012b204:
            ::std::__throw_bad_function_call();
LAB_0012b209:
            ::std::__throw_bad_function_call();
LAB_0012b20e:
            ::std::__throw_bad_function_call();
LAB_0012b213:
            ::std::__throw_bad_function_call();
LAB_0012b218:
            ::std::__throw_bad_function_call();
LAB_0012b21d:
            ::std::__throw_bad_function_call();
LAB_0012b222:
            ::std::__throw_bad_function_call();
LAB_0012b227:
            ::std::__throw_bad_function_call();
LAB_0012b22c:
            ::std::__throw_bad_function_call();
            goto LAB_0012b231;
          }
LAB_0012a8cc:
          local_b8 = local_b8 - 0x10;
          local_c0 = local_c0 - 0x10;
          uVar12 = local_118;
        } while (local_118 < uVar23);
      }
    }
  }
  return;
}

Assistant:

void format_data(
    function<void(const void*, size_t)> write_data,
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  if (num_iovs == 0) {
    return;
  }

  size_t total_size = 0;
  for (size_t x = 0; x < num_iovs; x++) {
    total_size += iovs[x].iov_len;
  }
  if (total_size == 0) {
    return;
  }

  if (num_prev_iovs) {
    size_t total_prev_size = 0;
    for (size_t x = 0; x < num_prev_iovs; x++) {
      total_prev_size += prev_iovs[x].iov_len;
    }
    if (total_prev_size != total_size) {
      throw runtime_error("previous iovs given, but data size does not match");
    }
  }

  uint64_t end_address = start_address + total_size;

  int width_digits;
  if (flags & PrintDataFlags::OFFSET_8_BITS) {
    width_digits = 2;
  } else if (flags & PrintDataFlags::OFFSET_16_BITS) {
    width_digits = 4;
  } else if (flags & PrintDataFlags::OFFSET_32_BITS) {
    width_digits = 8;
  } else if (flags & PrintDataFlags::OFFSET_64_BITS) {
    width_digits = 16;
  } else if (end_address > 0x100000000) {
    width_digits = 16;
  } else if (end_address > 0x10000) {
    width_digits = 8;
  } else if (end_address > 0x100) {
    width_digits = 4;
  } else {
    width_digits = 2;
  }

  bool use_color = flags & PrintDataFlags::USE_COLOR;
  bool print_ascii = flags & PrintDataFlags::PRINT_ASCII;
  bool print_float = flags & PrintDataFlags::PRINT_FLOAT;
  bool print_double = flags & PrintDataFlags::PRINT_DOUBLE;
  bool reverse_endian = flags & PrintDataFlags::REVERSE_ENDIAN_FLOATS;
  bool big_endian = flags & PrintDataFlags::BIG_ENDIAN_FLOATS;
  bool little_endian = flags & PrintDataFlags::LITTLE_ENDIAN_FLOATS;
  bool collapse_zero_lines = flags & PrintDataFlags::COLLAPSE_ZERO_LINES;
  bool skip_separator = flags & PrintDataFlags::SKIP_SEPARATOR;

  // Reserve space for the current/previous line data
  uint8_t line_buf[0x10];
  memset(line_buf, 0, sizeof(line_buf));

  uint8_t prev_line_buf[0x10];
  uint8_t* prev_line_data = prev_line_buf;
  if (num_prev_iovs) {
    memset(prev_line_buf, 0, sizeof(prev_line_buf));
  } else {
    prev_line_data = line_buf;
  }

  size_t current_iov_index = 0;
  size_t current_iov_bytes = 0;
  size_t prev_iov_index = 0;
  size_t prev_iov_bytes = 0;
  for (uint64_t line_start_address = start_address & (~0x0F);
       line_start_address < end_address;
       line_start_address += 0x10) {

    // Figure out the boundaries of the current line
    uint64_t line_end_address = line_start_address + 0x10;
    uint8_t line_invalid_start_bytes = max<int64_t>(start_address - line_start_address, 0);
    uint8_t line_invalid_end_bytes = max<int64_t>(line_end_address - end_address, 0);
    uint8_t line_bytes = 0x10 - line_invalid_end_bytes - line_invalid_start_bytes;

    auto print_fields_column = [&]<typename LoadedDataT, typename StoredDataT>(
                                   const char* field_format,
                                   const void* blank_format,
                                   size_t blank_format_len) -> void {
      write_data(" |", skip_separator ? 1 : 2);

      const auto* line_fields = reinterpret_cast<const StoredDataT*>(line_buf);
      const auto* prev_line_fields = reinterpret_cast<const StoredDataT*>(prev_line_data);
      uint8_t line_invalid_start_fields = (line_invalid_start_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);
      uint8_t line_invalid_end_fields = (line_invalid_end_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);

      constexpr size_t field_count = 0x10 / sizeof(StoredDataT);
      size_t x = 0;
      for (; x < line_invalid_start_fields; x++) {
        write_data(blank_format, blank_format_len);
      }
      for (; x < static_cast<size_t>(field_count - line_invalid_end_fields); x++) {
        LoadedDataT current_value = line_fields[x];
        LoadedDataT previous_value = prev_line_fields[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        string field = string_printf(field_format, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < field_count; x++) {
        write_data(blank_format, blank_format_len);
      }
    };

    // Read the current and previous data for this line
    for (size_t x = 0; x < line_bytes; x++) {
      while (current_iov_bytes >= iovs[current_iov_index].iov_len) {
        current_iov_bytes = 0;
        current_iov_index++;
        if (current_iov_index >= num_iovs) {
          throw logic_error("reads exceeded final iov");
        }
      }
      line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
          iovs[current_iov_index].iov_base)[current_iov_bytes];
      current_iov_bytes++;
    }
    if (num_prev_iovs) {
      for (size_t x = 0; x < line_bytes; x++) {
        while (prev_iov_bytes >= prev_iovs[prev_iov_index].iov_len) {
          prev_iov_bytes = 0;
          prev_iov_index++;
          if (prev_iov_index >= num_prev_iovs) {
            throw logic_error("reads exceeded final prev iov");
          }
        }
        prev_line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
            prev_iovs[prev_iov_index].iov_base)[prev_iov_bytes];
        prev_iov_bytes++;
      }
    }

    if (collapse_zero_lines && (line_start_address > start_address) && (line_end_address < end_address) &&
        !memcmp(line_buf, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16) &&
        !memcmp(prev_line_data, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16)) {
      continue;
    }

    string line = string_printf(skip_separator ? "%0*" PRIX64 : "%0*" PRIX64 " |",
        width_digits, line_start_address);
    write_data(line.data(), line.size());

    {
      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data("   ", 3);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g(write_data, use_color && (previous_value != current_value));
        string field = string_printf(" %02" PRIX8, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < 0x10; x++) {
        write_data("   ", 3);
      }
    }

    if (print_ascii) {
      write_data(" | ", skip_separator ? 1 : 3);

      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data(" ", 1);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        if ((current_value < 0x20) || (current_value >= 0x7F)) {
          InverseTerminalGuard g2(write_data, use_color);
          write_data(" ", 1);
        } else {
          write_data(&current_value, 1);
        }
      }
      for (; x < 0x10; x++) {
        write_data(" ", 1);
      }
    }

    if (print_float) {
      if (reverse_endian) {
        print_fields_column.operator()<float, re_float>(" %12.5g", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<float, be_float>(" %12.5g", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<float, le_float>(" %12.5g", "             ", 13);
      } else {
        print_fields_column.operator()<float, float>(" %12.5g", "             ", 13);
      }
    }
    if (print_double) {
      if (reverse_endian) {
        print_fields_column.operator()<double, re_double>(" %12.5lg", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<double, be_double>(" %12.5lg", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<double, le_double>(" %12.5lg", "             ", 13);
      } else {
        print_fields_column.operator()<double, double>(" %12.5lg", "             ", 13);
      }
    }

    write_data("\n", 1);
  }
}